

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O1

t_symbol * binbuf_realizedollsym(t_symbol *s,int ac,t_atom *av,int tonew)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  t_symbol *ptVar5;
  t_atom *ptVar6;
  char *pcVar7;
  uint uVar8;
  size_t sVar9;
  char *pcVar10;
  t_atom dollarnull;
  char buf [1000];
  char buf2 [1000];
  t_atom local_818;
  ushort local_808 [249];
  undefined1 local_616;
  char local_418 [999];
  undefined1 local_31;
  
  pcVar10 = s->s_name;
  local_818.a_type = A_FLOAT;
  iVar2 = canvas_getdollarzero();
  local_818.a_w.w_float = (t_float)iVar2;
  local_31 = 0;
  local_418[0] = '\0';
  pcVar3 = strchr(pcVar10,0x24);
  if ((pcVar3 == (char *)0x0) || (sVar9 = (long)pcVar3 - (long)pcVar10, 999 < (long)sVar9)) {
    return s;
  }
  strncpy(local_418,pcVar10,sVar9);
  local_418[sVar9] = '\0';
  do {
    pcVar10 = pcVar3 + 1;
    uVar4 = atol(pcVar10);
    local_808[0] = local_808[0] & 0xff00;
    uVar8 = 0xffffffff;
    pcVar7 = pcVar10;
    if (0xf5 < (byte)(pcVar3[1] - 0x3aU)) {
      do {
        cVar1 = *pcVar7;
        uVar8 = uVar8 + 1;
        pcVar7 = pcVar7 + 1;
      } while ((byte)(cVar1 - 0x30U) < 10);
    }
    if ((byte)(pcVar3[1] - 0x3aU) < 0xf6) {
      local_808[0] = 0x24;
LAB_00169775:
      uVar8 = 0;
    }
    else {
      iVar2 = (int)uVar4;
      if (iVar2 < 0 || ac < iVar2) {
        if (tonew == 0) goto LAB_00169775;
        sprintf((char *)local_808,"$%d",uVar4 & 0xffffffff);
      }
      else {
        ptVar6 = av + (iVar2 - 1);
        if (iVar2 == 0) {
          ptVar6 = &local_818;
        }
        if (ptVar6->a_type == A_SYMBOL) {
          ptVar6 = av + (iVar2 - 1);
          if (iVar2 == 0) {
            ptVar6 = &local_818;
          }
          strncpy((char *)local_808,((ptVar6->a_w).w_symbol)->s_name,499);
          local_616 = 0;
        }
        else {
          atom_string(ptVar6,(char *)local_808,499);
        }
      }
    }
    if ((int)uVar8 < 0) goto LAB_0016989c;
    if ((uVar8 == 0 && tonew == 0) && ((char)local_808[0] == '\0')) {
      return (t_symbol *)0x0;
    }
    sVar9 = strlen(local_418);
    strncat(local_418,(char *)local_808,999 - sVar9);
    pcVar10 = pcVar10 + uVar8;
    pcVar3 = strchr(pcVar10,0x24);
    if (pcVar3 == (char *)0x0) {
      sVar9 = strlen(local_418);
      strncat(local_418,pcVar10,999 - sVar9);
LAB_0016989c:
      ptVar5 = gensym(local_418);
      return ptVar5;
    }
    sVar9 = strlen(local_418);
    uVar4 = 999 - sVar9;
    if ((ulong)((long)pcVar3 - (long)pcVar10) < 999 - sVar9) {
      uVar4 = (long)pcVar3 - (long)pcVar10;
    }
    strncat(local_418,pcVar10,uVar4);
  } while( true );
}

Assistant:

t_symbol *binbuf_realizedollsym(t_symbol *s, int ac, const t_atom *av,
    int tonew)
{
    char buf[MAXPDSTRING];
    char buf2[MAXPDSTRING];
    const char*str=s->s_name;
    char*substr;
    int next=0;
    t_atom dollarnull;
    SETFLOAT(&dollarnull, canvas_getdollarzero());
    buf2[0] = buf2[MAXPDSTRING-1] = 0;

    substr=strchr(str, '$');
    if (!substr || substr-str >= MAXPDSTRING)
        return (s);

    strncpy(buf2, str, (substr-str));
    buf2[substr-str] = 0;
    str=substr+1;

    while((next=binbuf_expanddollsym(str, buf, &dollarnull, ac, av, tonew))>=0)
    {
        /*
        * JMZ: i am not sure what this means, so i might have broken it
        * it seems like that if "tonew" is set and the $arg cannot be expanded
        * (or the dollarsym is in reality a A_DOLLAR)
        * 0 is returned from binbuf_realizedollsym
        * this happens, when expanding in a message-box, but does not happen
        * when the A_DOLLSYM is the name of a subpatch
        */
        if (!tonew && (0==next) && (0==*buf))
        {
            return 0; /* JMZ: this should mimic the original behaviour */
        }

        strncat(buf2, buf, MAXPDSTRING-strlen(buf2)-1);
        str+=next;
        substr=strchr(str, '$');
        if (substr)
        {
            unsigned long n = substr-str;
            if(n>MAXPDSTRING-strlen(buf2)-1) n=MAXPDSTRING-strlen(buf2)-1;
            strncat(buf2, str, n);
            str=substr+1;
        }
        else
        {
            strncat(buf2, str, MAXPDSTRING-strlen(buf2)-1);
            goto done;
        }
    }
done:
    return (gensym(buf2));
}